

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderPassMultiviewCreateInfo *create_info,ScratchAllocator *alloc)

{
  uint32_t *puVar1;
  int32_t *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t *puVar6;
  undefined8 *puVar7;
  void *pvVar8;
  size_t sVar9;
  
  puVar7 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
  if (puVar7 != (undefined8 *)0x0) {
    uVar3 = *(undefined8 *)create_info;
    pvVar8 = create_info->pNext;
    uVar4 = *(undefined8 *)&create_info->subpassCount;
    puVar1 = create_info->pViewMasks;
    uVar5 = *(undefined8 *)&create_info->dependencyCount;
    piVar2 = create_info->pViewOffsets;
    puVar6 = create_info->pCorrelationMasks;
    puVar7[6] = *(undefined8 *)&create_info->correlationMaskCount;
    puVar7[7] = puVar6;
    puVar7[4] = uVar5;
    puVar7[5] = piVar2;
    puVar7[2] = uVar4;
    puVar7[3] = puVar1;
    *puVar7 = uVar3;
    puVar7[1] = pvVar8;
  }
  if (puVar7[3] != 0) {
    if ((ulong)create_info->subpassCount == 0) {
LAB_001243bb:
      pvVar8 = (void *)0x0;
    }
    else {
      puVar1 = create_info->pViewMasks;
      sVar9 = (ulong)create_info->subpassCount << 2;
      pvVar8 = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
      if (pvVar8 == (void *)0x0) goto LAB_001243bb;
      memmove(pvVar8,puVar1,sVar9);
    }
    puVar7[3] = pvVar8;
  }
  if (puVar7[5] != 0) {
    if ((ulong)create_info->dependencyCount == 0) {
LAB_00124402:
      pvVar8 = (void *)0x0;
    }
    else {
      piVar2 = create_info->pViewOffsets;
      sVar9 = (ulong)create_info->dependencyCount << 2;
      pvVar8 = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
      if (pvVar8 == (void *)0x0) goto LAB_00124402;
      memmove(pvVar8,piVar2,sVar9);
    }
    puVar7[5] = pvVar8;
  }
  if (puVar7[7] == 0) {
    return puVar7;
  }
  if ((ulong)create_info->correlationMaskCount != 0) {
    puVar1 = create_info->pCorrelationMasks;
    sVar9 = (ulong)create_info->correlationMaskCount << 2;
    pvVar8 = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
    if (pvVar8 != (void *)0x0) {
      memmove(pvVar8,puVar1,sVar9);
      goto LAB_0012444c;
    }
  }
  pvVar8 = (void *)0x0;
LAB_0012444c:
  puVar7[7] = pvVar8;
  return puVar7;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(
		const VkRenderPassMultiviewCreateInfo *create_info,
		ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pViewMasks)
		info->pViewMasks = copy(create_info->pViewMasks, create_info->subpassCount, alloc);
	if (info->pViewOffsets)
		info->pViewOffsets = copy(create_info->pViewOffsets, create_info->dependencyCount, alloc);
	if (info->pCorrelationMasks)
		info->pCorrelationMasks = copy(create_info->pCorrelationMasks, create_info->correlationMaskCount, alloc);

	return info;
}